

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamTaperedTimoshenkoFPM.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementBeamTaperedTimoshenkoFPM::EvaluateSectionDisplacement
          (ChElementBeamTaperedTimoshenkoFPM *this,double eta,ChVector<double> *u_displ,
          ChVector<double> *u_rotaz)

{
  int iVar1;
  void *pvVar2;
  undefined8 *puVar3;
  double *pdVar4;
  ChVectorDynamic<> u_vector;
  ChVectorDynamic<> displ;
  ChMatrixNM<double,_6,_12> Nx;
  ShapeFunctionGroupFPM NxBx;
  assign_op<double,_double> local_781;
  Matrix<double,__1,_1,_0,__1,_1> local_780;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_770;
  double local_758;
  SrcXprType local_750;
  Matrix<double,_6,_12,_1,_6,_12> local_740;
  ShapeFunctionGroupFPM local_500;
  
  local_758 = eta;
  iVar1 = (*(this->super_ChElementBeamTaperedTimoshenko).super_ChElementBeam.super_ChElementGeneric.
            super_ChElementBase._vptr_ChElementBase[3])();
  local_770.m_storage.m_data = (double *)0x0;
  local_770.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_770,(long)iVar1);
  (*(this->super_ChElementBeamTaperedTimoshenko).super_ChElementBeam.super_ChElementGeneric.
    super_ChElementBase._vptr_ChElementBase[6])(this,&local_770);
  ShapeFunctionsTimoshenkoFPM(this,&local_500,local_758);
  memcpy(&local_740,
         &local_500.
          super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_Eigen::Matrix<double,_6,_12,_1,_6,_12>_>
          .super__Head_base<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_false>,0x240);
  if (local_770.m_storage.m_rows != 0xc) {
    __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                  ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                  "Eigen::Product<Eigen::Matrix<double, 6, 12, 1>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, 6, 12, 1>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
                 );
  }
  local_780.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  local_780.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  local_750.m_lhs = &local_740;
  local_750.m_rhs = (RhsNested)&local_770;
  pvVar2 = malloc(0x70);
  if (pvVar2 == (void *)0x0) {
    pdVar4 = (double *)0x0;
  }
  else {
    *(void **)(((ulong)pvVar2 & 0xffffffffffffffc0) + 0x38) = pvVar2;
    pdVar4 = (double *)(((ulong)pvVar2 & 0xffffffffffffffc0) + 0x40);
  }
  if (pdVar4 != (double *)0x0) {
    local_780.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 6;
    local_780.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         pdVar4;
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Product<Eigen::Matrix<double,_6,_12,_1,_6,_12>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run(&local_780,&local_750,&local_781);
    if ((((0 < local_780.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows) &&
         (u_displ->m_data[0] =
               *local_780.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_data,
         local_780.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
         != 1)) &&
        (u_displ->m_data[1] =
              local_780.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_data[1],
        2 < local_780.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows)) &&
       (((u_displ->m_data[2] =
               local_780.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data[2],
         local_780.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
         != 3 && (u_rotaz->m_data[0] =
                       local_780.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_data[3],
                 4 < local_780.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_rows)) &&
        (u_rotaz->m_data[1] =
              local_780.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_data[4],
        local_780.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
        5)))) {
      u_rotaz->m_data[2] =
           local_780.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
           [5];
      free((void *)local_780.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_data[-1]);
      if (local_770.m_storage.m_data != (double *)0x0) {
        free((void *)local_770.m_storage.m_data[-1]);
      }
      return;
    }
    __assert_fail("index >= 0 && index < size()",
                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                 );
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = std::ostream::_M_insert<bool>;
  __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

void ChElementBeamTaperedTimoshenkoFPM::EvaluateSectionDisplacement(const double eta,
                                                                    ChVector<>& u_displ,
                                                                    ChVector<>& u_rotaz) {
    ChVectorDynamic<> displ(this->GetNdofs());
    this->GetStateBlock(displ);
    // No transformation for the displacement of two nodes,
    // so the section displacement is evaluated at the centerline of beam

    ShapeFunctionGroupFPM NxBx;
    ShapeFunctionsTimoshenkoFPM(NxBx, eta);
    // the shape function matrix
    ChMatrixNM<double, 6, 12> Nx = std::get<0>(NxBx);

    // the displacements and rotations, as a vector
    ChVectorDynamic<> u_vector = Nx * displ;

    u_displ.x() = u_vector(0);
    u_displ.y() = u_vector(1);
    u_displ.z() = u_vector(2);
    u_rotaz.x() = u_vector(3);
    u_rotaz.y() = u_vector(4);
    u_rotaz.z() = u_vector(5);
}